

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

ES5ArrayTypeHandler * __thiscall
Js::SimpleTypeHandler<2UL>::ConvertToES5ArrayType
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance)

{
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar1;
  ScriptContext *pSVar2;
  ES5ArrayTypeHandler *newTypeHandler;
  DynamicObject *instance_local;
  SimpleTypeHandler<2UL> *this_local;
  
  pEVar1 = SimpleTypeHandler<2ul>::ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
                     ((SimpleTypeHandler<2ul> *)this,instance);
  pSVar2 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar2->convertSimpleToDictionaryCount = pSVar2->convertSimpleToDictionaryCount + 1;
  return pEVar1;
}

Assistant:

ES5ArrayTypeHandler* SimpleTypeHandler<size>::ConvertToES5ArrayType(DynamicObject* instance)
    {
        ES5ArrayTypeHandler* newTypeHandler = ConvertToTypeHandler<ES5ArrayTypeHandler>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleToDictionaryCount++;
#endif
        return newTypeHandler;
    }